

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O1

bool dxil_spv::emit_get_dimensions_instruction(Impl *impl,CallInst *instruction)

{
  uint uVar1;
  mapped_type *pmVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  Id IVar6;
  Id IVar7;
  Dim DVar8;
  Builder *builder;
  Value *pVVar9;
  mapped_type *pmVar10;
  Operation *pOVar11;
  Operation *pOVar12;
  Operation *this;
  undefined7 extraout_var;
  char cVar13;
  undefined4 uVar14;
  ulong uVar15;
  int iVar16;
  Op op;
  uint uVar17;
  uint32_t num_coords;
  Id image_id;
  uint32_t local_68;
  undefined4 local_64;
  uint local_60;
  Id local_5c;
  mapped_type *local_58;
  undefined1 local_50 [16];
  initializer_list<unsigned_int> local_40;
  
  bVar3 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  if (!bVar3) {
    return true;
  }
  builder = Converter::Impl::builder(impl);
  pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_5c = Converter::Impl::get_id_for_value(impl,pVVar9,0);
  IVar6 = Converter::Impl::get_type_id(impl,local_5c);
  pmVar10 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&impl->handle_to_resource_meta,&local_5c);
  local_40._M_array = (iterator)instruction;
  local_58 = std::__detail::
             _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->llvm_composite_meta,(key_type *)&local_40);
  local_68 = 0;
  IVar7 = pmVar10->index_offset_id;
  if (pmVar10->storage == StorageClassStorageBuffer) {
    IVar6 = spv::Builder::makeIntegerType(builder,0x20,false);
    if (IVar7 == 0) {
      pOVar11 = Converter::Impl::allocate(impl,OpArrayLength,IVar6);
      Operation::add_id(pOVar11,local_5c);
    }
    else {
      pOVar11 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar6);
      Operation::add_id(pOVar11,pmVar10->index_offset_id);
    }
    Operation::add_literal(pOVar11,(uint)(IVar7 != 0));
    bVar4 = pmVar10->component_type + I1;
    if ((0xb < bVar4) || ((0xf51U >> (bVar4 & 0x1f) & 1) == 0)) {
      __assert_fail("0 && \"Invalid component type.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/converter_impl.hpp"
                    ,0x7a,"unsigned int dxil_spv::raw_component_type_to_bits(DXIL::ComponentType)");
    }
    uVar17 = (pmVar10->raw_component_vecsize + V2) * *(int *)(&DAT_001c7588 + (ulong)bVar4 * 4) >> 3
    ;
    local_60 = 0;
    Converter::Impl::add(impl,pOVar11,false);
LAB_00170ec8:
    local_68 = 1;
    uVar14 = 0;
  }
  else {
    if (IVar7 != 0) {
      local_60 = 0;
      IVar7 = spv::Builder::makeIntegerType(builder,0x20,false);
      pOVar11 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar7);
      Operation::add_id(pOVar11,pmVar10->index_offset_id);
      Operation::add_literal(pOVar11,1);
      Converter::Impl::add(impl,pOVar11,false);
      uVar17 = 4;
      goto LAB_00170ec8;
    }
    bVar3 = get_image_dimensions_query_size(impl,builder,local_5c,&local_68);
    if (!bVar3) {
      return false;
    }
    bVar3 = spv::Builder::isStorageImageType(builder,IVar6);
    bVar5 = spv::Builder::isMultisampledImageType(builder,IVar6);
    local_64 = (undefined4)CONCAT71(extraout_var,bVar5);
    if (bVar3) {
      local_60 = 0;
    }
    else {
      DVar8 = spv::Builder::getTypeDimensionality(builder,IVar6);
      uVar15 = CONCAT71(extraout_var,bVar5) & 0xffffffff;
      local_60 = (uint)CONCAT71((int7)(uVar15 >> 8),((byte)uVar15 ^ 1) & DVar8 != DimBuffer);
    }
    pmVar2 = local_58;
    IVar7 = spv::Builder::makeIntegerType(builder,0x20,false);
    if (1 < local_68) {
      IVar7 = spv::Builder::makeVectorType(builder,IVar7,local_68);
    }
    if ((pmVar2->access_mask & 7) == 0) {
      local_68 = 0;
      pOVar11 = (Operation *)0x0;
    }
    else {
      cVar13 = (char)local_60;
      pOVar11 = Converter::Impl::allocate(impl,OpImageQuerySize - (local_60 & 0xff),IVar7);
      Operation::add_id(pOVar11,local_5c);
      if (cVar13 != '\0') {
        pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
        IVar7 = Converter::Impl::get_id_for_value(impl,pVVar9,0);
        Operation::add_id(pOVar11,IVar7);
      }
      Converter::Impl::add(impl,pOVar11,false);
    }
    uVar17 = 4;
    uVar14 = local_64;
  }
  local_50._8_8_ = instruction;
  if (pmVar10->kind == StructuredBuffer) {
    local_64 = uVar14;
    IVar7 = spv::Builder::makeIntegerType(builder,0x20,false);
    pOVar12 = Converter::Impl::allocate(impl,OpUDiv,IVar7);
    if ((pmVar10->index_offset_id == 0) || (pmVar10->aliased == false)) {
      local_50._0_4_ = pOVar11->id;
      uVar1 = pmVar10->stride;
      IVar7 = spv::Builder::makeIntegerType(builder,0x20,false);
      local_50._4_4_ = spv::Builder::makeIntConstant(builder,IVar7,uVar1 / uVar17,false);
    }
    else {
      local_50._0_4_ = pOVar11->id;
      uVar17 = pmVar10->stride;
      IVar7 = spv::Builder::makeIntegerType(builder,0x20,false);
      local_50._4_4_ = spv::Builder::makeIntConstant(builder,IVar7,uVar17,false);
    }
    local_40._M_array = (iterator)local_50;
    local_40._M_len = 2;
    Operation::add_ids(pOVar12,&local_40);
    Converter::Impl::add(impl,pOVar12,false);
    cVar13 = (char)local_64;
  }
  else {
    if (pmVar10->kind == RawBuffer) {
      local_64 = uVar14;
      IVar7 = spv::Builder::makeIntegerType(builder,0x20,false);
      pOVar12 = Converter::Impl::allocate(impl,OpIMul,IVar7);
      local_50._0_4_ = pOVar11->id;
      IVar7 = spv::Builder::makeIntegerType(builder,0x20,false);
      local_50._4_4_ = spv::Builder::makeIntConstant(builder,IVar7,uVar17,false);
      local_40._M_len = 2;
      local_40._M_array = (iterator)local_50;
      Operation::add_ids(pOVar12,&local_40);
      Converter::Impl::add(impl,pOVar12,false);
      pOVar11 = pOVar12;
      uVar14 = local_64;
    }
    cVar13 = (char)uVar14;
    pOVar12 = pOVar11;
  }
  pmVar2 = local_58;
  if ((local_58->access_mask & 8) == 0) {
LAB_00171049:
    pOVar11 = (Operation *)0x0;
  }
  else {
    if ((char)local_60 == '\0') {
      if (cVar13 == '\0') goto LAB_00171049;
      IVar7 = spv::Builder::makeIntegerType(builder,0x20,false);
      op = OpImageQuerySamples;
    }
    else {
      IVar7 = spv::Builder::makeIntegerType(builder,0x20,false);
      op = OpImageQueryLevels;
    }
    pOVar11 = Converter::Impl::allocate(impl,op,IVar7);
    Operation::add_id(pOVar11,local_5c);
    Converter::Impl::add(impl,pOVar11,false);
  }
  if (pOVar12 == (Operation *)0x0 && pOVar11 == (Operation *)0x0) {
    __assert_fail("aux_op || dimensions_op",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/opcodes/dxil/dxil_sampling.cpp"
                  ,0x40e,
                  "bool dxil_spv::emit_get_dimensions_instruction(Converter::Impl &, const LLVMBC::CallInst *)"
                 );
  }
  if (pOVar11 == (Operation *)0x0 && pOVar12 != (Operation *)0x0) {
    if (local_68 == 1) {
      pmVar2->forced_composite = false;
    }
    IVar7 = pOVar12->id;
  }
  else {
    if (pOVar12 != (Operation *)0x0) {
      IVar7 = spv::Builder::makeIntegerType(builder,0x20,false);
      IVar7 = spv::Builder::makeVectorType(builder,IVar7,4);
      this = Converter::Impl::allocate(impl,OpCompositeConstruct,(Value *)local_50._8_8_,IVar7);
      Operation::add_id(this,pOVar12->id);
      if (local_68 < 3) {
        iVar16 = local_68 - 3;
        do {
          IVar7 = spv::Builder::makeIntegerType(builder,0x20,false);
          IVar7 = spv::Builder::createUndefined(builder,IVar7);
          Operation::add_id(this,IVar7);
          iVar16 = iVar16 + 1;
        } while (iVar16 != 0);
      }
      Operation::add_id(this,pOVar11->id);
      Converter::Impl::add(impl,this,false);
      goto LAB_001711d8;
    }
    pmVar2->forced_composite = false;
    pmVar2->access_mask = 1;
    pmVar2->components = 1;
    IVar7 = pOVar11->id;
  }
  Converter::Impl::rewrite_value(impl,(Value *)local_50._8_8_,IVar7);
LAB_001711d8:
  local_40._M_array = (iterator)CONCAT44(local_40._M_array._4_4_,0x32);
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&builder->capabilities,(Capability *)&local_40);
  return true;
}

Assistant:

bool emit_get_dimensions_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_type_id = impl.get_type_id(image_id);
	auto &meta = impl.handle_to_resource_meta[image_id];

	uint32_t ssbo_element_size = 4;

	Operation *dimensions_op = nullptr;
	auto &access_meta = impl.llvm_composite_meta[instruction];
	uint32_t num_coords = 0;
	bool has_samples = false;
	bool has_lod = false;

	if (meta.storage == spv::StorageClassStorageBuffer)
	{
		if (meta.index_offset_id)
		{
			dimensions_op = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));
			dimensions_op->add_id(meta.index_offset_id);
			dimensions_op->add_literal(1);
		}
		else
		{
			dimensions_op = impl.allocate(spv::OpArrayLength, builder.makeUintType(32));
			dimensions_op->add_id(image_id);
			dimensions_op->add_literal(0);
		}

		ssbo_element_size = raw_vecsize_to_vecsize(meta.raw_component_vecsize) *
		                    raw_component_type_to_bits(meta.component_type) / 8;

		impl.add(dimensions_op);
		num_coords = 1;
	}
	else if (meta.index_offset_id)
	{
		dimensions_op = impl.allocate(spv::OpCompositeExtract, builder.makeUintType(32));
		dimensions_op->add_id(meta.index_offset_id);
		dimensions_op->add_literal(1);
		impl.add(dimensions_op);
		num_coords = 1;
	}
	else
	{
		if (!get_image_dimensions_query_size(impl, builder, image_id, &num_coords))
			return false;

		bool is_uav = builder.isStorageImageType(image_type_id);
		has_samples = builder.isMultisampledImageType(image_type_id);
		has_lod = !is_uav && builder.getTypeDimensionality(image_type_id) != spv::DimBuffer && !has_samples;

		spv::Id dim_type_id = builder.makeUintType(32);
		if (num_coords > 1)
			dim_type_id = builder.makeVectorType(dim_type_id, num_coords);

		if ((access_meta.access_mask & 7) != 0)
		{
			dimensions_op = impl.allocate(has_lod ? spv::OpImageQuerySizeLod : spv::OpImageQuerySize, dim_type_id);
			dimensions_op->add_id(image_id);
			if (has_lod)
				dimensions_op->add_id(impl.get_id_for_value(instruction->getOperand(2)));
			impl.add(dimensions_op);
		}
		else
			num_coords = 0;
	}

	if (meta.kind == DXIL::ResourceKind::RawBuffer)
	{
		Operation *byte_size_op = impl.allocate(spv::OpIMul, builder.makeUintType(32));
		byte_size_op->add_ids({ dimensions_op->id, builder.makeUintConstant(ssbo_element_size) });
		impl.add(byte_size_op);
		dimensions_op = byte_size_op;
	}
	else if (meta.kind == DXIL::ResourceKind::StructuredBuffer)
	{
		Operation *elem_count_op = impl.allocate(spv::OpUDiv, builder.makeUintType(32));

		if (meta.index_offset_id != 0)
		{
			// If the offset buffer is pre-shifted, shift the divider as well.
			if (!meta.aliased)
				elem_count_op->add_ids({ dimensions_op->id, builder.makeUintConstant(meta.stride / ssbo_element_size) });
			else
				elem_count_op->add_ids({ dimensions_op->id, builder.makeUintConstant(meta.stride) });
		}
		else
			elem_count_op->add_ids({ dimensions_op->id, builder.makeUintConstant(meta.stride / ssbo_element_size) });

		impl.add(elem_count_op);
		dimensions_op = elem_count_op;
	}

	Operation *aux_op = nullptr;
	if ((access_meta.access_mask & (1u << 3)) != 0)
	{
		if (has_lod)
		{
			aux_op = impl.allocate(spv::OpImageQueryLevels, builder.makeUintType(32));
			aux_op->add_id(image_id);
			impl.add(aux_op);
		}
		else if (has_samples)
		{
			aux_op = impl.allocate(spv::OpImageQuerySamples, builder.makeUintType(32));
			aux_op->add_id(image_id);
			impl.add(aux_op);
		}
	}

	assert(aux_op || dimensions_op);

	if (!aux_op && dimensions_op)
	{
		if (num_coords == 1)
			access_meta.forced_composite = false;
		impl.rewrite_value(instruction, dimensions_op->id);
	}
	else if (dimensions_op)
	{
		Operation *op =
		    impl.allocate(spv::OpCompositeConstruct, instruction, builder.makeVectorType(builder.makeUintType(32), 4));
		op->add_id(dimensions_op->id);

		// This element cannot be statically accessed if we don't have LOD, so don't bother returning anything here.
		// Otherwise, we need to pad out.
		for (unsigned i = num_coords; i < 3; i++)
			op->add_id(builder.createUndefined(builder.makeUintType(32)));
		op->add_id(aux_op->id);

		impl.add(op);
	}
	else
	{
		// Redirect any extract from this scalar to be preserved as-is.
		// Pretend this is a scalar even if Levels/Samples query is supposed to live in W.
		access_meta.forced_composite = false;
		access_meta.access_mask = 1;
		access_meta.components = 1;
		impl.rewrite_value(instruction, aux_op->id);
	}

	builder.addCapability(spv::CapabilityImageQuery);
	return true;
}